

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int binsert(bstring b1,int pos,bstring b2,uchar fill)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  bstring local_48;
  bstring aux;
  ptrdiff_t pd;
  int l;
  int i;
  int d;
  uchar fill_local;
  bstring b2_local;
  int pos_local;
  bstring b1_local;
  
  if (((((pos < 0) || (b1 == (bstring)0x0)) || (b2 == (bstring)0x0)) ||
      ((b1->slen < 0 || (b2->slen < 0)))) || ((b1->mlen < b1->slen || (b1->mlen < 1)))) {
    b1_local._4_4_ = -1;
  }
  else {
    lVar4 = (long)b2->data - (long)b1->data;
    local_48 = b2;
    if (((lVar4 < 0) || (b1->mlen <= lVar4)) || (local_48 = bstrcpy(b2), local_48 != (bstring)0x0))
    {
      uVar1 = b1->slen + local_48->slen;
      uVar2 = pos + local_48->slen;
      if ((int)(uVar1 | uVar2) < 0) {
        if (local_48 != b2) {
          bdestroy(local_48);
        }
        b1_local._4_4_ = -1;
      }
      else {
        if ((int)uVar1 < (int)uVar2) {
          iVar3 = balloc(b1,uVar2 + 1);
          if (iVar3 != 0) {
            if (local_48 != b2) {
              bdestroy(local_48);
            }
            return -1;
          }
          for (l = b1->slen; l < pos; l = l + 1) {
            b1->data[l] = fill;
          }
          b1->slen = uVar2;
        }
        else {
          iVar3 = balloc(b1,uVar1 + 1);
          pd._4_4_ = uVar1;
          if (iVar3 != 0) {
            if (local_48 != b2) {
              bdestroy(local_48);
            }
            return -1;
          }
          while (pd._4_4_ = pd._4_4_ - 1, (int)uVar2 <= (int)pd._4_4_) {
            b1->data[(int)pd._4_4_] = b1->data[(int)(pd._4_4_ - local_48->slen)];
          }
          b1->slen = uVar1;
        }
        if (0 < local_48->slen) {
          memmove(b1->data + pos,local_48->data,(long)local_48->slen);
        }
        b1->data[b1->slen] = '\0';
        if (local_48 != b2) {
          bdestroy(local_48);
        }
        b1_local._4_4_ = 0;
      }
    }
    else {
      b1_local._4_4_ = -1;
    }
  }
  return b1_local._4_4_;
}

Assistant:

int binsert (bstring b1, int pos, const bstring b2, unsigned char fill) {
int d, i, l;
ptrdiff_t pd;
bstring aux = b2;

	if (pos < 0 || b1 == NULL || b2 == NULL || b1->slen < 0 || 
	    b2->slen < 0 || b1->mlen < b1->slen || b1->mlen <= 0) return BSTR_ERR;

	/* Aliasing case */
	if ((pd = (ptrdiff_t) (b2->data - b1->data)) >= 0 && pd < (ptrdiff_t) b1->mlen) {
		if (NULL == (aux = bstrcpy (b2))) return BSTR_ERR;
	}

	/* Compute the two possible end pointers */
	d = b1->slen + aux->slen;
	l = pos + aux->slen;
	if ((d|l) < 0)
    {
        if (aux != b2) bdestroy (aux);
        return BSTR_ERR;
    }

	if (l > d) {
		/* Inserting past the end of the string */
		if (balloc (b1, l + 1) != BSTR_OK) {
			if (aux != b2) bdestroy (aux);
			return BSTR_ERR;
		}
		for (d = b1->slen; d < pos; d++) b1->data[d] = fill;
		b1->slen = l;
	} else {
		/* Inserting in the middle of the string */
		if (balloc (b1, d + 1) != BSTR_OK) {
			if (aux != b2) bdestroy (aux);
			return BSTR_ERR;
		}
		for (i = d - 1; i >= l; i--) {
			b1->data[i] = b1->data[i - aux->slen];
		}
		b1->slen = d;
	}
	bBlockCopy (b1->data + pos, aux->data, aux->slen);
	b1->data[b1->slen] = (unsigned char) '\0';
	if (aux != b2) bdestroy (aux);
	return 0;
}